

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
::operator()(QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
             *this,idx_t *input)

{
  RESULT_TYPE_conflict RVar1;
  undefined8 *in_RDI;
  INPUT_TYPE *in_stack_ffffffffffffffd8;
  QuantileIndirect<short> *this_00;
  
  this_00 = (QuantileIndirect<short> *)*in_RDI;
  QuantileIndirect<short>::operator()(this_00,in_stack_ffffffffffffffd8);
  RVar1 = MadAccessor<short,_short,_short>::operator()
                    ((MadAccessor<short,_short,_short> *)this_00,
                     (INPUT_TYPE_conflict *)in_stack_ffffffffffffffd8);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}